

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfdcore_wally_util.cpp
# Opt level: O0

vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
* cfd::core::WallyUtil::GetSupportedMnemonicLanguages_abi_cxx11_(void)

{
  undefined8 uVar1;
  char *wally_string;
  CfdException *in_RDI;
  string *message;
  CfdError error_code;
  CfdException *this;
  allocator local_d1;
  string local_d0 [32];
  string local_b0 [32];
  undefined1 local_90 [8];
  string lang;
  undefined1 local_59 [33];
  CfdSourceLocation local_38;
  int local_1c;
  WallyUtil *pWStack_18;
  int ret;
  char *wally_lang;
  
  pWStack_18 = (WallyUtil *)0x0;
  this = in_RDI;
  local_1c = bip39_get_languages((char **)&stack0xffffffffffffffe8);
  if (local_1c != 0) {
    local_38.filename =
         strrchr("//workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd-go/external/cfd-core/src/cfdcore_wally_util.cpp"
                 ,0x2f);
    error_code = (CfdError)((ulong)in_RDI >> 0x20);
    local_38.filename = local_38.filename + 1;
    local_38.line = 0x11e;
    local_38.funcname = "GetSupportedMnemonicLanguages";
    logger::warn<int&>(&local_38,"Get languages error. ret=[{}]",&local_1c);
    lang.field_2._M_local_buf[0xb] = '\x01';
    uVar1 = __cxa_allocate_exception(0x30);
    message = (string *)local_59;
    ::std::allocator<char>::allocator();
    ::std::__cxx11::string::string
              ((string *)(local_59 + 1),"Get languages error.",(allocator *)message);
    CfdException::CfdException(this,error_code,message);
    lang.field_2._M_local_buf[0xb] = '\0';
    __cxa_throw(uVar1,&CfdException::typeinfo,CfdException::~CfdException);
  }
  ConvertStringAndFree_abi_cxx11_((string *)local_90,pWStack_18,wally_string);
  ::std::__cxx11::string::string(local_b0,(string *)local_90);
  ::std::allocator<char>::allocator();
  ::std::__cxx11::string::string(local_d0," ",&local_d1);
  StringUtil::Split((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     *)in_RDI,(string *)local_b0,(string *)local_d0);
  ::std::__cxx11::string::~string(local_d0);
  ::std::allocator<char>::~allocator((allocator<char> *)&local_d1);
  ::std::__cxx11::string::~string(local_b0);
  ::std::__cxx11::string::~string((string *)local_90);
  return (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *)this;
}

Assistant:

std::vector<std::string> WallyUtil::GetSupportedMnemonicLanguages() {
  char* wally_lang = NULL;
  int ret = bip39_get_languages(&wally_lang);
  if (ret != WALLY_OK) {
    warn(CFD_LOG_SOURCE, "Get languages error. ret=[{}]", ret);
    throw CfdException(
        CfdError::kCfdIllegalArgumentError, "Get languages error.");
  }

  // free and get string
  std::string lang = ConvertStringAndFree(wally_lang);
  return StringUtil::Split(std::string(lang), kMnemonicDelimiter);
}